

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferViewAccessTests.cpp
# Opt level: O0

TestCaseGroup * vkt::api::createBufferViewAccessTests(TestContext *testCtx)

{
  BufferViewCaseParams bufferViewTestInfo;
  BufferViewCaseParams bufferViewTestInfo_00;
  undefined8 uVar1;
  TestCaseGroup *pTVar2;
  ostream *poVar3;
  TestNode *pTVar4;
  BufferViewTestCase *pBVar5;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  ostringstream local_598 [8];
  ostringstream description_2;
  BufferViewCaseParams info_2;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  ostringstream local_3a8 [8];
  ostringstream description_1;
  BufferViewCaseParams info_1;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  ostringstream local_1b8 [8];
  ostringstream description;
  BufferViewCaseParams info;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> bufferViewTests;
  TestContext *testCtx_local;
  
  bufferViewTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data._8_8_ = testCtx;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    bufferViewTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"access","BufferView Access Tests");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&info.elementOffset + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar2
            );
  info.bufferSize = 0;
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  poVar3 = std::operator<<((ostream *)local_1b8,"bufferSize: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x200);
  poVar3 = std::operator<<(poVar3," bufferViewSize: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x200);
  poVar3 = std::operator<<(poVar3," bufferView element offset: ");
  std::ostream::operator<<(poVar3,info.bufferSize);
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pBVar5 = (BufferViewTestCase *)operator_new(0x80);
  uVar1 = bufferViewTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"buffer_view_memory_test_complete",&local_1d9);
  std::__cxx11::ostringstream::str();
  bufferViewTestInfo_00.elementOffset = info.bufferSize;
  bufferViewTestInfo_00.bufferSize = 0x200;
  bufferViewTestInfo_00.bufferViewSize = 0x200;
  anon_unknown_1::BufferViewTestCase::BufferViewTestCase
            (pBVar5,(TestContext *)uVar1,&local_1d8,&local_200,bufferViewTestInfo_00);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pBVar5);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  std::__cxx11::ostringstream::ostringstream(local_3a8);
  poVar3 = std::operator<<((ostream *)local_3a8,"bufferSize: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1000);
  poVar3 = std::operator<<(poVar3," bufferViewSize: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x200);
  poVar3 = std::operator<<(poVar3," bufferView element offset: ");
  std::ostream::operator<<(poVar3,0);
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pBVar5 = (BufferViewTestCase *)operator_new(0x80);
  uVar1 = bufferViewTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"buffer_view_memory_test_partial_offset0",&local_3c9);
  std::__cxx11::ostringstream::str();
  anon_unknown_1::BufferViewTestCase::BufferViewTestCase
            (pBVar5,(TestContext *)uVar1,&local_3c8,&local_3f0,
             (BufferViewCaseParams)ZEXT812(0x20000001000));
  tcu::TestNode::addChild(pTVar4,(TestNode *)pBVar5);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::__cxx11::ostringstream::~ostringstream(local_3a8);
  std::__cxx11::ostringstream::ostringstream(local_598);
  poVar3 = std::operator<<((ostream *)local_598,"bufferSize: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1000);
  poVar3 = std::operator<<(poVar3," bufferViewSize: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x200);
  poVar3 = std::operator<<(poVar3," bufferView element offset: ");
  std::ostream::operator<<(poVar3,0x80);
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pBVar5 = (BufferViewTestCase *)operator_new(0x80);
  uVar1 = bufferViewTests.
          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"buffer_view_memory_test_partial_offset1",&local_5b9);
  std::__cxx11::ostringstream::str();
  bufferViewTestInfo.elementOffset = 0x80;
  bufferViewTestInfo.bufferSize = 0x1000;
  bufferViewTestInfo.bufferViewSize = 0x200;
  anon_unknown_1::BufferViewTestCase::BufferViewTestCase
            (pBVar5,(TestContext *)uVar1,&local_5b8,&local_5e0,bufferViewTestInfo);
  tcu::TestNode::addChild(pTVar4,(TestNode *)pBVar5);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::__cxx11::ostringstream::~ostringstream(local_598);
  pTVar2 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createBufferViewAccessTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	bufferViewTests	(new tcu::TestCaseGroup(testCtx, "access", "BufferView Access Tests"));

	{
		BufferViewCaseParams info =
		{
			512,	// deUint32	bufferSize
			512,	// deUint32	bufferViewSize
			0,		// deUint32	elementOffset
		};
		std::ostringstream description;
		description << "bufferSize: " << info.bufferSize << " bufferViewSize: " << info.bufferViewSize << " bufferView element offset: " << info.elementOffset;
		bufferViewTests->addChild(new BufferViewTestCase(testCtx, "buffer_view_memory_test_complete", description.str(), info));
	}

	{
		BufferViewCaseParams info =
		{
			4096,	// deUint32	bufferSize
			512,	// deUint32	bufferViewSize
			0,		// deUint32	elementOffset
		};
		std::ostringstream description;
		description << "bufferSize: " << info.bufferSize << " bufferViewSize: " << info.bufferViewSize << " bufferView element offset: " << info.elementOffset;
		bufferViewTests->addChild(new BufferViewTestCase(testCtx, "buffer_view_memory_test_partial_offset0", description.str(), info));
	}

	{
		BufferViewCaseParams info =
		{
			4096,	// deUint32	bufferSize
			512,	// deUint32	bufferViewSize
			128,	// deUint32	elementOffset
		};
		std::ostringstream description;
		description << "bufferSize: " << info.bufferSize << " bufferViewSize: " << info.bufferViewSize << " bufferView element offset: " << info.elementOffset;
		bufferViewTests->addChild(new BufferViewTestCase(testCtx, "buffer_view_memory_test_partial_offset1", description.str(), info));
	}

	return bufferViewTests.release();
}